

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O0

char * afm_parser_next_key(AFM_Parser parser,FT_Bool line,FT_Offset *len)

{
  AFM_Stream stream_00;
  FT_Byte *local_38;
  char *local_30;
  char *key;
  AFM_Stream stream;
  FT_Offset *len_local;
  FT_Bool line_local;
  AFM_Parser parser_local;
  
  stream_00 = parser->stream;
  if (line == '\0') {
    do {
      while (stream_00->status < 1) {
        afm_stream_read_one(stream_00);
      }
      stream_00->status = 0;
      local_30 = afm_stream_read_one(stream_00);
    } while (((local_30 == (char *)0x0) && (stream_00->status < 3)) && (0 < stream_00->status));
  }
  else {
    do {
      if (stream_00->status < 2) {
        afm_stream_read_string(stream_00);
      }
      stream_00->status = 0;
      local_30 = afm_stream_read_one(stream_00);
    } while (((local_30 == (char *)0x0) && (stream_00->status < 3)) && (1 < stream_00->status));
  }
  if (len != (FT_Offset *)0x0) {
    if (local_30 == (char *)0x0) {
      local_38 = (FT_Byte *)0x0;
    }
    else {
      local_38 = stream_00->cursor + (-1 - (long)local_30);
    }
    *len = (FT_Offset)local_38;
  }
  return local_30;
}

Assistant:

FT_LOCAL_DEF( char* )
  afm_parser_next_key( AFM_Parser  parser,
                       FT_Bool     line,
                       FT_Offset*  len )
  {
    AFM_Stream  stream = parser->stream;
    char*       key    = NULL;  /* make stupid compiler happy */


    if ( line )
    {
      while ( 1 )
      {
        /* skip current line */
        if ( !AFM_STATUS_EOL( stream ) )
          afm_stream_read_string( stream );

        stream->status = AFM_STREAM_STATUS_NORMAL;
        key = afm_stream_read_one( stream );

        /* skip empty line */
        if ( !key                      &&
             !AFM_STATUS_EOF( stream ) &&
             AFM_STATUS_EOL( stream )  )
          continue;

        break;
      }
    }
    else
    {
      while ( 1 )
      {
        /* skip current column */
        while ( !AFM_STATUS_EOC( stream ) )
          afm_stream_read_one( stream );

        stream->status = AFM_STREAM_STATUS_NORMAL;
        key = afm_stream_read_one( stream );

        /* skip empty column */
        if ( !key                      &&
             !AFM_STATUS_EOF( stream ) &&
             AFM_STATUS_EOC( stream )  )
          continue;

        break;
      }
    }

    if ( len )
      *len = ( key ) ? (FT_Offset)AFM_STREAM_KEY_LEN( stream, key )
                     : 0;

    return key;
  }